

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_ptr_tests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3889::StatePointer_SetState_Test::TestBody(StatePointer_SetState_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_f8;
  Message local_f0;
  unsigned_long local_e8;
  state_type local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_3;
  Message local_c0;
  Foo *local_b8;
  pointer_type local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_2;
  Message local_90;
  unsigned_long local_88;
  state_type local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_60 [3];
  Message local_48;
  Foo *local_40;
  pointer_type local_38;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> p;
  Foo foo;
  StatePointer_SetState_Test *this_local;
  
  putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::state_ptr
            ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)&gtest_ar.message_,
             (pointer_type)((long)&p.m_ptr_and_state + 4),1);
  local_38 = putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::get_ptr
                       ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)
                        &gtest_ar.message_);
  local_40 = (Foo *)((long)&p.m_ptr_and_state + 4);
  testing::internal::EqHelper<false>::
  Compare<(anonymous_namespace)::Foo*,(anonymous_namespace)::Foo*>
            ((EqHelper<false> *)local_30,"p.get_ptr()","&foo",&local_38,&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=(local_60,&local_48);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    testing::Message::~Message(&local_48);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_80 = putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::get_state
                         ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)
                          &gtest_ar.message_);
    local_88 = 1;
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
              ((EqHelper<false> *)local_78,"p.get_state()","1ul",&local_80,&local_88);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
                 ,0x27,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_90);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_90);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::set_state
                ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)&gtest_ar.message_,2);
      local_b0 = putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::get_ptr
                           ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)
                            &gtest_ar.message_);
      local_b8 = (Foo *)((long)&p.m_ptr_and_state + 4);
      testing::internal::EqHelper<false>::
      Compare<(anonymous_namespace)::Foo*,(anonymous_namespace)::Foo*>
                ((EqHelper<false> *)local_a8,"p.get_ptr()","&foo",&local_b0,&local_b8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
      if (!bVar1) {
        testing::Message::Message(&local_c0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
                   ,0x29,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_c0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_c0);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        local_e0 = putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::get_state
                             ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)
                              &gtest_ar.message_);
        local_e8 = 2;
        testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                  ((EqHelper<false> *)local_d8,"p.get_state()","2ul",&local_e0,&local_e8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
        if (!bVar1) {
          testing::Message::Message(&local_f0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
          testing::internal::AssertHelper::AssertHelper
                    (&local_f8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
                     ,0x2a,pcVar2);
          testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
          testing::internal::AssertHelper::~AssertHelper(&local_f8);
          testing::Message::~Message(&local_f0);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
      }
    }
  }
  return;
}

Assistant:

TEST(StatePointer, SetState) {
	Foo foo;
	state_ptr<Foo> p{&foo, 1};
	ASSERT_EQ(p.get_ptr(), &foo);
	ASSERT_EQ(p.get_state(), 1ul);
	p.set_state(2);
	ASSERT_EQ(p.get_ptr(), &foo);
	ASSERT_EQ(p.get_state(), 2ul);
}